

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O2

void brngHMACStart(void *state,octet *key,size_t key_len,octet *iv,size_t iv_len)

{
  void *dest;
  size_t sVar1;
  size_t count;
  octet *dest_00;
  
  *(size_t *)((long)state + 0x48) = iv_len;
  dest_00 = iv;
  if (iv_len < 0x41) {
    dest_00 = (octet *)((long)state + 8);
    memCopy(dest_00,iv,iv_len);
  }
  *(octet **)state = dest_00;
  dest = (void *)((long)state + 0x98);
  sVar1 = beltHMAC_keep();
  beltHMACStart((void *)((long)state + sVar1 + 0x98),key,key_len);
  sVar1 = beltHMAC_keep();
  count = beltHMAC_keep();
  memCopy(dest,(void *)((long)state + sVar1 + 0x98),count);
  beltHMACStepA(iv,iv_len,dest);
  beltHMACStepG((octet *)((long)state + 0x50),dest);
  *(undefined8 *)((long)state + 0x90) = 0;
  return;
}

Assistant:

void brngHMACStart(void* state, const octet key[], size_t key_len, 
	const octet iv[], size_t iv_len)
{
	brng_hmac_st* s = (brng_hmac_st*)state;
	ASSERT(memIsDisjoint2(s, brngHMAC_keep(), key, key_len));
	ASSERT(memIsDisjoint2(s, brngHMAC_keep(), iv, iv_len));
	// запомнить iv
	if ((s->iv_len = iv_len) <= 64) 
	{
		memCopy(s->iv_buf, iv, iv_len);
		s->iv = s->iv_buf;
	}
	else
		s->iv = iv;
	// обработать key
	beltHMACStart(s->state_ex + beltHMAC_keep(), key, key_len);
	// r <- beltHMAC(key, iv)
	memCopy(s->state_ex, s->state_ex + beltHMAC_keep(), beltHMAC_keep());
	beltHMACStepA(iv, iv_len, s->state_ex);
	beltHMACStepG(s->r, s->state_ex);
	// нет выходных данных
	s->reserved = 0;
}